

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_uart.c
# Opt level: O0

void test_parity(void)

{
  cio_uart_parity local_10b8;
  cio_error local_10b4;
  cio_uart_parity parity;
  cio_error err;
  cio_uart uart;
  cio_uart_parity cStack_28;
  uint i;
  cio_uart_parity tests [5];
  
  _cStack_28 = 0x100000002;
  tests[0] = CIO_UART_PARITY_EVEN;
  tests[1] = CIO_UART_PARITY_MARK;
  tests[2] = CIO_UART_PARITY_SPACE;
  for (uart.impl.loop._4_4_ = 0; uart.impl.loop._4_4_ < 5;
      uart.impl.loop._4_4_ = uart.impl.loop._4_4_ + 1) {
    strncpy((char *)&uart.close_hook,"/dev/stdout",0x1001);
    cio_uart_init((cio_uart *)&parity,&loop,(cio_uart_close_hook_t)0x0);
    local_10b4 = cio_uart_set_parity((cio_uart *)&parity,(&cStack_28)[uart.impl.loop._4_4_]);
    UnityAssertEqualNumber(0,(long)local_10b4,"Setting parity failed",0x6a,UNITY_DISPLAY_STYLE_INT);
    local_10b4 = cio_uart_get_parity((cio_uart *)&parity,&local_10b8);
    UnityAssertEqualNumber(0,(long)local_10b4,"Getting parity failed",0x6e,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              ((ulong)(&cStack_28)[uart.impl.loop._4_4_],(ulong)local_10b8,
               "Get/Set of parity does not match!",0x70,UNITY_DISPLAY_STYLE_INT);
    cio_uart_close((cio_uart *)&parity);
  }
  return;
}

Assistant:

static void test_parity(void)
{
	enum cio_uart_parity tests[] = {CIO_UART_PARITY_NONE, CIO_UART_PARITY_ODD, CIO_UART_PARITY_EVEN, CIO_UART_PARITY_MARK, CIO_UART_PARITY_SPACE};

	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct cio_uart uart;
		strncpy(uart.impl.name, "/dev/stdout", sizeof(uart.impl.name));
		cio_uart_init(&uart, &loop, NULL);
		enum cio_error err = cio_uart_set_parity(&uart, tests[i]);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Setting parity failed");

		enum cio_uart_parity parity;
		err = cio_uart_get_parity(&uart, &parity);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Getting parity failed");

		TEST_ASSERT_EQUAL_MESSAGE(tests[i], parity, "Get/Set of parity does not match!");
		cio_uart_close(&uart);
	}
}